

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

int __thiscall QHttpSocketEngine::option(QHttpSocketEngine *this,SocketOption option)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)(this + 8) + 0xf8);
  iVar2 = -1;
  if (plVar1 != (long *)0x0) {
    if (option == KeepAliveOption) {
      lVar3 = *plVar1;
      uVar4 = 1;
    }
    else {
      if (option != LowDelayOption) goto LAB_00227109;
      lVar3 = *plVar1;
      uVar4 = 0;
    }
    (**(code **)(lVar3 + 0x128))(&QStack_38,plVar1,uVar4);
    iVar2 = QVariant::toInt((bool *)&QStack_38);
    QVariant::~QVariant(&QStack_38);
  }
LAB_00227109:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QHttpSocketEngine::option(SocketOption option) const
{
    Q_D(const QHttpSocketEngine);
    if (d->socket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            return d->socket->socketOption(QAbstractSocket::LowDelayOption).toInt();
        if (option == QAbstractSocketEngine::KeepAliveOption)
            return d->socket->socketOption(QAbstractSocket::KeepAliveOption).toInt();
    }
    return -1;
}